

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptAsyncSpawnStepFunction * __thiscall
Js::JavascriptLibrary::CreateAsyncSpawnStepFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,JavascriptGenerator *generator,
          Var argument,Var resolve,Var reject,bool isReject)

{
  Recycler *pRVar1;
  FunctionInfo *this_00;
  JavascriptAsyncSpawnStepFunction *this_01;
  JavascriptGenerator *local_e0;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_b1;
  TrackAllocData local_b0;
  DynamicType *local_88;
  DynamicType *type;
  undefined8 local_78;
  TrackAllocData local_70;
  FunctionInfo *local_48;
  FunctionInfo *functionInfo;
  Var pvStack_38;
  bool isReject_local;
  Var reject_local;
  Var resolve_local;
  Var argument_local;
  JavascriptGenerator *generator_local;
  JavascriptMethod entryPoint_local;
  JavascriptLibrary *this_local;
  
  functionInfo._7_1_ = isReject;
  pvStack_38 = reject;
  reject_local = resolve;
  resolve_local = argument;
  argument_local = generator;
  generator_local = (JavascriptGenerator *)entryPoint;
  entryPoint_local = (JavascriptMethod)this;
  pRVar1 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_70,(type_info *)&FunctionInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x1831);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_70);
  type = (DynamicType *)Memory::Recycler::AllocInlined;
  local_78 = 0;
  this_00 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar1,0x43c4b0);
  FunctionInfo::FunctionInfo
            (this_00,(JavascriptMethod)generator_local,None,0xffffffff,(FunctionProxy *)0x0);
  if ((this->inDispatchProfileMode & 1U) == 0) {
    local_e0 = generator_local;
  }
  else {
    local_e0 = (JavascriptGenerator *)ScriptContext::DebugProfileProbeThunk;
  }
  local_48 = this_00;
  local_88 = CreateDeferredPrototypeFunctionType(this,(JavascriptMethod)local_e0);
  pRVar1 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_b0,(type_info *)&JavascriptAsyncSpawnStepFunction::typeinfo,0,0xffffffffffffffff
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x183f);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_b0);
  this_01 = (JavascriptAsyncSpawnStepFunction *)
            new<(Memory::ObjectInfoBits)1>(0x68,pRVar1,&local_b1);
  JavascriptAsyncSpawnStepFunction::JavascriptAsyncSpawnStepFunction
            (this_01,local_88,local_48,(JavascriptGenerator *)argument_local,resolve_local,
             reject_local,pvStack_38,(bool)(functionInfo._7_1_ & 1));
  return this_01;
}

Assistant:

JavascriptAsyncSpawnStepFunction* JavascriptLibrary::CreateAsyncSpawnStepFunction(
        JavascriptMethod entryPoint,
        JavascriptGenerator* generator,
        Var argument,
        Var resolve,
        Var reject,
        bool isReject)
    {
        FunctionInfo* functionInfo = RecyclerNew(GetRecycler(), FunctionInfo, entryPoint);
        DynamicType* type = CreateDeferredPrototypeFunctionType(
            this->inDispatchProfileMode ? ProfileEntryThunk : entryPoint);

        return RecyclerNewEnumClass(
            GetRecycler(),
            EnumFunctionClass,
            JavascriptAsyncSpawnStepFunction,
            type,
            functionInfo,
            generator,
            argument,
            resolve,
            reject,
            isReject);
    }